

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

double __thiscall despot::Logger::AverageDiscountedRoundReward(Logger *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  int i;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pdVar1 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar6 = 0.0;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    dVar6 = dVar6 + pdVar1[lVar4];
  }
  dVar5 = 0.0;
  if (pdVar2 != pdVar1) {
    dVar5 = dVar6 / (double)lVar3;
  }
  return dVar5;
}

Assistant:

double Logger::AverageDiscountedRoundReward() const {
	double sum = 0;
	for (int i = 0; i < discounted_round_rewards_.size(); i++) {
		double reward = discounted_round_rewards_[i];
		sum += reward;
	}
	return discounted_round_rewards_.size() > 0 ?
			(sum / discounted_round_rewards_.size()) : 0.0;
}